

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp_number.hpp
# Opt level: O0

value_type __thiscall standards::exp_number::operator_cast_to_float(exp_number<float> *this)

{
  uint *in_RDI;
  double dVar1;
  value_type local_4;
  
  if (in_RDI[1] == 1) {
    dVar1 = std::exp((double)(ulong)*in_RDI);
    local_4 = SUB84(dVar1,0);
  }
  else if (in_RDI[1] == 0xffffffff) {
    dVar1 = std::exp((double)(ulong)*in_RDI);
    local_4 = -SUB84(dVar1,0);
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

operator value_type() const {
    if (sign_ == is_positive)
      return std::exp(log_);
    else if (sign_ == is_negative)
      return -std::exp(log_);
    else
      return 0;
  }